

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.hpp
# Opt level: O1

xml_attribute __thiscall
pugi::xml_node::find_attribute<NULLCPugiXML::predicate_nullc_attribute>
          (xml_node *this,predicate_nullc_attribute pred)

{
  bool bVar1;
  unspecified_bool_type p_Var2;
  xml_attribute local_28;
  predicate_nullc_attribute local_20;
  
  local_20.callback.id = pred.callback.id;
  local_20.callback.context = pred.callback.context;
  if (this->_root != (xml_node_struct *)0x0) {
    local_28 = first_attribute(this);
    p_Var2 = xml_attribute::operator_cast_to_function_pointer(&local_28);
    if (p_Var2 != (unspecified_bool_type)0x0) {
      do {
        bVar1 = NULLCPugiXML::predicate_nullc_attribute::operator()(&local_20,&local_28);
        if (bVar1) {
          return (xml_attribute)local_28._attr;
        }
        local_28 = xml_attribute::next_attribute(&local_28);
        p_Var2 = xml_attribute::operator_cast_to_function_pointer(&local_28);
      } while (p_Var2 != (unspecified_bool_type)0x0);
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

xml_attribute find_attribute(Predicate pred) const
		{
			if (!_root) return xml_attribute();

			for (xml_attribute attrib = first_attribute(); attrib; attrib = attrib.next_attribute())
				if (pred(attrib))
					return attrib;

			return xml_attribute();
		}